

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen_interactive.cpp
# Opt level: O0

void __thiscall ftxui::ScreenInteractive::Loop(ScreenInteractive *this,Component *component)

{
  allocator<ftxui::(anonymous_namespace)::DECMode> *this_00;
  initializer_list<ftxui::(anonymous_namespace)::DECMode> __l;
  initializer_list<ftxui::(anonymous_namespace)::DECMode> __l_00;
  initializer_list<ftxui::(anonymous_namespace)::DECMode> __l_01;
  bool bVar1;
  int iVar2;
  pointer pRVar3;
  ostream *poVar4;
  Mouse *pMVar5;
  element_type *peVar6;
  Event local_2e8;
  int local_2a4;
  undefined1 local_2a0 [8];
  Event event;
  shared_ptr<ftxui::ComponentBase> local_240;
  undefined1 local_230 [16];
  _func_void_atomic<bool>_ptr_unique_ptr<ftxui::SenderImpl<ftxui::Event>,_std::default_delete<ftxui::SenderImpl<ftxui::Event>_>_>
  *local_220;
  thread local_218;
  thread event_listener;
  vector<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
  local_1f0;
  allocator<ftxui::(anonymous_namespace)::DECMode> local_1d1;
  undefined1 local_1d0 [16];
  _Map_pointer local_1c0;
  vector<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
  local_1b8;
  anon_class_8_1_8991fb9c local_1a0;
  value_type local_198;
  allocator<ftxui::(anonymous_namespace)::DECMode> local_175;
  DECMode local_174;
  iterator local_170;
  size_type local_168;
  vector<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
  local_160;
  anon_class_1_0_00000001 local_143;
  anon_class_1_0_00000001 local_142;
  anon_class_1_0_00000001 local_141;
  anon_class_1_0_00000001 disable;
  anon_class_1_0_00000001 enable;
  anon_class_8_1_8991fb9c aStack_140;
  anon_class_1_0_00000001 flush;
  termios local_138;
  value_type local_f0;
  undefined1 auStack_d0 [8];
  termios terminal;
  int signal;
  const_iterator __end1;
  const_iterator __begin1;
  undefined8 local_78;
  undefined8 local_70;
  initializer_list<int> local_68;
  initializer_list<int> *local_58;
  initializer_list<int> *__range1;
  anon_class_8_1_8991fb9c local_40;
  value_type local_38;
  Component *local_18;
  Component *component_local;
  ScreenInteractive *this_local;
  
  local_40.this = this;
  local_18 = component;
  component_local = (Component *)this;
  std::function<void()>::
  function<ftxui::ScreenInteractive::Loop(std::shared_ptr<ftxui::ComponentBase>)::__0,void>
            ((function<void()> *)&local_38,&local_40);
  std::
  stack<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
  ::push((stack<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
          *)(anonymous_namespace)::on_exit_functions,&local_38);
  std::function<void_()>::~function(&local_38);
  __begin1 = (const_iterator)0xb0000000f;
  local_78 = 0x400000002;
  local_70 = 0x800000006;
  local_68._M_array = (iterator)&__begin1;
  local_68._M_len = 6;
  local_58 = &local_68;
  __end1 = std::initializer_list<int>::begin(local_58);
  register0x00000000 = std::initializer_list<int>::end(local_58);
  for (; __end1 != stack0xffffffffffffff70; __end1 = __end1 + 1) {
    terminal.c_ispeed = *__end1;
    anon_unknown_0::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)&(anonymous_namespace)::install_signal_handler,
               terminal.c_ispeed,anon_unknown_0::OnExit);
  }
  tcgetattr(0,(termios *)auStack_d0);
  local_138._52_8_ = terminal._44_8_;
  local_138.c_cc[0xf] = terminal.c_cc[7];
  local_138.c_cc[0x10] = terminal.c_cc[8];
  local_138.c_cc[0x11] = terminal.c_cc[9];
  local_138.c_cc[0x12] = terminal.c_cc[10];
  local_138.c_cc[0x13] = terminal.c_cc[0xb];
  local_138.c_cc[0x14] = terminal.c_cc[0xc];
  local_138.c_cc[0x15] = terminal.c_cc[0xd];
  local_138.c_cc[0x16] = terminal.c_cc[0xe];
  local_138.c_cc[7] = terminal.c_line;
  local_138.c_cc[8] = terminal.c_cc[0];
  local_138.c_cc[9] = terminal.c_cc[1];
  local_138.c_cc[10] = terminal.c_cc[2];
  local_138.c_cc[0xb] = terminal.c_cc[3];
  local_138.c_cc[0xc] = terminal.c_cc[4];
  local_138.c_cc[0xd] = terminal.c_cc[5];
  local_138.c_cc[0xe] = terminal.c_cc[6];
  local_138.c_iflag = auStack_d0._0_4_;
  local_138.c_oflag = auStack_d0._4_4_;
  std::function<void()>::
  function<ftxui::ScreenInteractive::Loop(std::shared_ptr<ftxui::ComponentBase>)::__1,void>
            ((function<void()> *)&local_f0,(anon_class_60_1_a183b7fa *)&local_138);
  std::
  stack<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
  ::push((stack<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
          *)(anonymous_namespace)::on_exit_functions,&local_f0);
  std::function<void_()>::~function(&local_f0);
  terminal.c_oflag = terminal.c_oflag & 0xfffffff5;
  terminal.c_lflag._3_1_ = 0;
  terminal.c_lflag._2_1_ = 0;
  tcsetattr(0,0,(termios *)auStack_d0);
  aStack_140.this = this;
  std::function<void()>::operator=
            ((function<void()> *)(anonymous_namespace)::on_resize,&stack0xfffffffffffffec0);
  anon_unknown_0::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&(anonymous_namespace)::install_signal_handler,0x1c,
             anon_unknown_0::OnResize);
  Loop::anon_class_1_0_00000001::operator()(&local_141);
  if ((this->use_alternative_screen_ & 1U) != 0) {
    local_174 = kAlternateScreen;
    local_170 = &local_174;
    local_168 = 1;
    std::allocator<ftxui::(anonymous_namespace)::DECMode>::allocator(&local_175);
    __l_01._M_len = local_168;
    __l_01._M_array = local_170;
    std::
    vector<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
    ::vector(&local_160,__l_01,&local_175);
    Loop::anon_class_1_0_00000001::operator()(&local_142,&local_160);
    std::
    vector<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
    ::~vector(&local_160);
    std::allocator<ftxui::(anonymous_namespace)::DECMode>::~allocator(&local_175);
  }
  local_1a0.this = this;
  std::function<void()>::
  function<ftxui::ScreenInteractive::Loop(std::shared_ptr<ftxui::ComponentBase>)::__6,void>
            ((function<void()> *)&local_198,&local_1a0);
  std::
  stack<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
  ::push((stack<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
          *)(anonymous_namespace)::on_exit_functions,&local_198);
  std::function<void_()>::~function(&local_198);
  local_1d0._0_4_ = kCursor;
  local_1d0._4_4_ = 7;
  local_1d0._8_8_ = local_1d0;
  local_1c0 = (_Map_pointer)0x2;
  std::allocator<ftxui::(anonymous_namespace)::DECMode>::allocator(&local_1d1);
  __l_00._M_len = (size_type)local_1c0;
  __l_00._M_array = (iterator)local_1d0._8_8_;
  std::
  vector<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
  ::vector(&local_1b8,__l_00,&local_1d1);
  Loop::anon_class_1_0_00000001::operator()(&local_143,&local_1b8);
  std::
  vector<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
  ::~vector(&local_1b8);
  std::allocator<ftxui::(anonymous_namespace)::DECMode>::~allocator(&local_1d1);
  event_listener._M_id._M_thread._4_4_ = 0x3eb;
  this_00 = (allocator<ftxui::(anonymous_namespace)::DECMode> *)
            ((long)&event_listener._M_id._M_thread + 3);
  std::allocator<ftxui::(anonymous_namespace)::DECMode>::allocator(this_00);
  __l._M_len = 3;
  __l._M_array = (iterator)((long)&event_listener._M_id._M_thread + 4);
  std::
  vector<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
  ::vector(&local_1f0,__l,this_00);
  Loop::anon_class_1_0_00000001::operator()(&local_142,&local_1f0);
  std::
  vector<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
  ::~vector(&local_1f0);
  std::allocator<ftxui::(anonymous_namespace)::DECMode>::~allocator
            ((allocator<ftxui::(anonymous_namespace)::DECMode> *)
             ((long)&event_listener._M_id._M_thread + 3));
  Loop::anon_class_1_0_00000001::operator()(&local_141);
  local_220 = anon_unknown_0::EventListener;
  local_230._8_8_ = &this->quit_;
  std::
  unique_ptr<ftxui::ReceiverImpl<ftxui::Event>,_std::default_delete<ftxui::ReceiverImpl<ftxui::Event>_>_>
  ::operator->(&this->event_receiver_);
  ReceiverImpl<ftxui::Event>::MakeSender((ReceiverImpl<ftxui::Event> *)local_230);
  std::thread::
  thread<void(*)(std::atomic<bool>*,std::unique_ptr<ftxui::SenderImpl<ftxui::Event>,std::default_delete<ftxui::SenderImpl<ftxui::Event>>>),std::atomic<bool>*,std::unique_ptr<ftxui::SenderImpl<ftxui::Event>,std::default_delete<ftxui::SenderImpl<ftxui::Event>>>,void>
            (&local_218,&local_220,(atomic<bool> **)(local_230 + 8),
             (unique_ptr<ftxui::SenderImpl<ftxui::Event>,_std::default_delete<ftxui::SenderImpl<ftxui::Event>_>_>
              *)local_230);
  std::
  unique_ptr<ftxui::SenderImpl<ftxui::Event>,_std::default_delete<ftxui::SenderImpl<ftxui::Event>_>_>
  ::~unique_ptr((unique_ptr<ftxui::SenderImpl<ftxui::Event>,_std::default_delete<ftxui::SenderImpl<ftxui::Event>_>_>
                 *)local_230);
  do {
    bVar1 = std::atomic::operator_cast_to_bool((atomic *)&this->quit_);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pRVar3 = std::
             unique_ptr<ftxui::ReceiverImpl<ftxui::Event>,_std::default_delete<ftxui::ReceiverImpl<ftxui::Event>_>_>
             ::operator->(&this->event_receiver_);
    bVar1 = ReceiverImpl<ftxui::Event>::HasPending(pRVar3);
    if (!bVar1) {
      std::shared_ptr<ftxui::ComponentBase>::shared_ptr(&local_240,component);
      Draw(this,&local_240);
      std::shared_ptr<ftxui::ComponentBase>::~shared_ptr(&local_240);
      Screen::ToString_abi_cxx11_((string *)&event.screen_,&this->super_Screen);
      poVar4 = std::operator<<((ostream *)&std::cout,(string *)&event.screen_);
      std::operator<<(poVar4,(string *)&this->set_cursor_position);
      std::__cxx11::string::~string((string *)&event.screen_);
      anon_unknown_0::Flush();
      Screen::Clear(&this->super_Screen);
    }
    Event::Event((Event *)local_2a0);
    pRVar3 = std::
             unique_ptr<ftxui::ReceiverImpl<ftxui::Event>,_std::default_delete<ftxui::ReceiverImpl<ftxui::Event>_>_>
             ::operator->(&this->event_receiver_);
    bVar1 = ReceiverImpl<ftxui::Event>::Receive(pRVar3,(Event *)local_2a0);
    if (bVar1) {
      bVar1 = Event::is_cursor_reporting((Event *)local_2a0);
      if (bVar1) {
        iVar2 = Event::cursor_x((Event *)local_2a0);
        this->cursor_x_ = iVar2;
        iVar2 = Event::cursor_y((Event *)local_2a0);
        this->cursor_y_ = iVar2;
        local_2a4 = 4;
      }
      else {
        bVar1 = Event::is_mouse((Event *)local_2a0);
        if (bVar1) {
          iVar2 = this->cursor_x_;
          pMVar5 = Event::mouse((Event *)local_2a0);
          pMVar5->x = pMVar5->x - iVar2;
          iVar2 = this->cursor_y_;
          pMVar5 = Event::mouse((Event *)local_2a0);
          pMVar5->y = pMVar5->y - iVar2;
        }
        event.input_.field_2._8_8_ = this;
        peVar6 = std::
                 __shared_ptr_access<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)component);
        Event::Event(&local_2e8,(Event *)local_2a0);
        (*peVar6->_vptr_ComponentBase[3])(peVar6,&local_2e8);
        Event::~Event(&local_2e8);
        local_2a4 = 0;
      }
    }
    else {
      local_2a4 = 5;
    }
    Event::~Event((Event *)local_2a0);
  } while ((local_2a4 == 0) || (local_2a4 == 4));
  std::thread::join();
  anon_unknown_0::OnExit(0);
  std::thread::~thread(&local_218);
  return;
}

Assistant:

void ScreenInteractive::Loop(Component component) {
  on_exit_functions.push([this] { ExitLoopClosure()(); });

  // Install signal handlers to restore the terminal state on exit. The default
  // signal handlers are restored on exit.
  for (int signal : {SIGTERM, SIGSEGV, SIGINT, SIGILL, SIGABRT, SIGFPE})
    install_signal_handler(signal, OnExit);

    // Save the old terminal configuration and restore it on exit.
#if defined(_WIN32)
  // Enable VT processing on stdout and stdin
  auto stdout_handle = GetStdHandle(STD_OUTPUT_HANDLE);
  auto stdin_handle = GetStdHandle(STD_INPUT_HANDLE);

  DWORD out_mode = 0;
  DWORD in_mode = 0;
  GetConsoleMode(stdout_handle, &out_mode);
  GetConsoleMode(stdin_handle, &in_mode);
  on_exit_functions.push([=] { SetConsoleMode(stdout_handle, out_mode); });
  on_exit_functions.push([=] { SetConsoleMode(stdin_handle, in_mode); });

  // https://docs.microsoft.com/en-us/windows/console/setconsolemode
  const int enable_virtual_terminal_processing = 0x0004;
  const int disable_newline_auto_return = 0x0008;
  out_mode |= enable_virtual_terminal_processing;
  out_mode |= disable_newline_auto_return;

  // https://docs.microsoft.com/en-us/windows/console/setconsolemode
  const int enable_line_input = 0x0002;
  const int enable_echo_input = 0x0004;
  const int enable_virtual_terminal_input = 0x0200;
  const int enable_window_input = 0x0008;
  in_mode &= ~enable_echo_input;
  in_mode &= ~enable_line_input;
  in_mode |= enable_virtual_terminal_input;
  in_mode |= enable_window_input;

  SetConsoleMode(stdin_handle, in_mode);
  SetConsoleMode(stdout_handle, out_mode);
#else
  struct termios terminal;
  tcgetattr(STDIN_FILENO, &terminal);
  on_exit_functions.push([=] { tcsetattr(STDIN_FILENO, TCSANOW, &terminal); });

  terminal.c_lflag &= ~ICANON;  // Non canonique terminal.
  terminal.c_lflag &= ~ECHO;    // Do not print after a key press.
  terminal.c_cc[VMIN] = 0;
  terminal.c_cc[VTIME] = 0;
  // auto oldf = fcntl(STDIN_FILENO, F_GETFL, 0);
  // fcntl(STDIN_FILENO, F_SETFL, oldf | O_NONBLOCK);
  // on_exit_functions.push([=] { fcntl(STDIN_FILENO, F_GETFL, oldf); });

  tcsetattr(STDIN_FILENO, TCSANOW, &terminal);

  // Handle resize.
  on_resize = [&] { event_sender_->Send(Event::Special({0})); };
  install_signal_handler(SIGWINCH, OnResize);
#endif

  // Commit state:
  auto flush = [&] {
    Flush();
    on_exit_functions.push([] { Flush(); });
  };

  auto enable = [&](std::vector<DECMode> parameters) {
    std::cout << Set(parameters);
    on_exit_functions.push([=] { std::cout << Reset(parameters); });
  };

  auto disable = [&](std::vector<DECMode> parameters) {
    std::cout << Reset(parameters);
    on_exit_functions.push([=] { std::cout << Set(parameters); });
  };

  flush();

  if (use_alternative_screen_) {
    enable({
        DECMode::kAlternateScreen,
    });
  }

  // On exit, reset cursor one line after the current drawing.
  on_exit_functions.push(
      [this] { std::cout << reset_cursor_position << std::endl; });

  disable({
      DECMode::kCursor,
      DECMode::kLineWrap,
  });

  enable({
      // DECMode::kMouseVt200,
      DECMode::kMouseAnyEvent,
      DECMode::kMouseUtf8,
      DECMode::kMouseSgrExtMode,
  });

  flush();

  auto event_listener =
      std::thread(&EventListener, &quit_, event_receiver_->MakeSender());

  // The main loop.
  while (!quit_) {
    if (!event_receiver_->HasPending()) {
      Draw(component);
      std::cout << ToString() << set_cursor_position;
      Flush();
      Clear();
    }

    Event event;
    if (!event_receiver_->Receive(&event))
      break;

    if (event.is_cursor_reporting()) {
      cursor_x_ = event.cursor_x();
      cursor_y_ = event.cursor_y();
      continue;
    }

    if (event.is_mouse()) {
      event.mouse().x -= cursor_x_;
      event.mouse().y -= cursor_y_;
    }

    event.screen_ = this;
    component->OnEvent(event);
  }

  event_listener.join();
  OnExit(0);
}